

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::DoubleAPFloat::fusedMultiplyAdd
          (DoubleAPFloat *this,DoubleAPFloat *Multiplicand,DoubleAPFloat *Addend,roundingMode RM)

{
  opStatus oVar1;
  undefined1 local_e0 [32];
  DoubleAPFloat local_c0;
  APFloat local_b0;
  DoubleAPFloat local_90;
  APFloat local_80;
  opStatus local_5c;
  undefined1 local_58 [4];
  opStatus Ret;
  undefined1 local_48 [8];
  APFloat Tmp;
  roundingMode RM_local;
  DoubleAPFloat *Addend_local;
  DoubleAPFloat *Multiplicand_local;
  DoubleAPFloat *this_local;
  
  Tmp.U._20_4_ = RM;
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x1048,
                  "APFloat::opStatus llvm::detail::DoubleAPFloat::fusedMultiplyAdd(const DoubleAPFloat &, const DoubleAPFloat &, APFloat::roundingMode)"
                 );
  }
  bitcastToAPInt((DoubleAPFloat *)local_58);
  APFloat::APFloat((APFloat *)local_48,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)local_58);
  APInt::~APInt((APInt *)local_58);
  bitcastToAPInt(&local_90);
  APFloat::APFloat(&local_80,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_90);
  bitcastToAPInt(&local_c0);
  APFloat::APFloat(&local_b0,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_c0);
  oVar1 = APFloat::fusedMultiplyAdd((APFloat *)local_48,&local_80,&local_b0,Tmp.U._20_4_);
  APFloat::~APFloat(&local_b0);
  APInt::~APInt((APInt *)&local_c0);
  APFloat::~APFloat(&local_80);
  APInt::~APInt((APInt *)&local_90);
  local_5c = oVar1;
  APFloat::bitcastToAPInt((APFloat *)local_e0);
  DoubleAPFloat((DoubleAPFloat *)(local_e0 + 0x10),(fltSemantics *)semPPCDoubleDouble,
                (APInt *)local_e0);
  operator=(this,(DoubleAPFloat *)(local_e0 + 0x10));
  ~DoubleAPFloat((DoubleAPFloat *)(local_e0 + 0x10));
  APInt::~APInt((APInt *)local_e0);
  oVar1 = local_5c;
  APFloat::~APFloat((APFloat *)local_48);
  return oVar1;
}

Assistant:

APFloat::opStatus
DoubleAPFloat::fusedMultiplyAdd(const DoubleAPFloat &Multiplicand,
                                const DoubleAPFloat &Addend,
                                APFloat::roundingMode RM) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  auto Ret = Tmp.fusedMultiplyAdd(
      APFloat(semPPCDoubleDoubleLegacy, Multiplicand.bitcastToAPInt()),
      APFloat(semPPCDoubleDoubleLegacy, Addend.bitcastToAPInt()), RM);
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}